

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTcpServer.cpp
# Opt level: O3

void __thiscall xs::TcpServer::deleteDoneConnections(TcpServer *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  
  deMutex_lock((this->m_connectionListLock).m_mutex);
  ppCVar2 = (this->m_doneConnections).
            super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_doneConnections).
            super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 != ppCVar1) {
    do {
      if (*ppCVar2 != (ConnectionHandler *)0x0) {
        (*((*ppCVar2)->super_Thread)._vptr_Thread[1])();
        ppCVar1 = (this->m_doneConnections).
                  super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppCVar2 = ppCVar2 + 1;
    } while (ppCVar2 != ppCVar1);
    ppCVar2 = (this->m_doneConnections).
              super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppCVar1 != ppCVar2) {
      (this->m_doneConnections).
      super__Vector_base<xs::ConnectionHandler_*,_std::allocator<xs::ConnectionHandler_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppCVar2;
    }
  }
  deMutex_unlock((this->m_connectionListLock).m_mutex);
  return;
}

Assistant:

void TcpServer::deleteDoneConnections (void)
{
	de::ScopedLock lock(m_connectionListLock);

	for (std::vector<ConnectionHandler*>::iterator i = m_doneConnections.begin(); i != m_doneConnections.end(); i++)
		delete *i;

	m_doneConnections.clear();
}